

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

Vec_Int_t * Gla_ManRefinement(Gla_Man_t *p)

{
  Gia_Man_t *p_00;
  long lVar1;
  int iVar2;
  Gla_Man_t *p_01;
  Abc_Cex_t *pAVar3;
  bool bVar4;
  int local_3c;
  Gia_Obj_t *pGStack_38;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVec;
  Vec_Int_t *vMap;
  Abc_Cex_t *pCex;
  Gla_Man_t *p_local;
  
  pCex = (Abc_Cex_t *)p;
  Gia_GlaPrepareCexAndMap(p,(Abc_Cex_t **)&vMap,&vVec);
  p_01 = (Gla_Man_t *)
         Rnm_ManRefine(*(Rnm_Man_t **)(pCex + 8),(Abc_Cex_t *)vMap,vVec,
                       *(int *)(*(long *)&pCex->nBits + 0x38),*(int *)(*(long *)&pCex->nBits + 0x40)
                       ,1);
  Abc_CexFree((Abc_Cex_t *)vMap);
  iVar2 = Vec_IntSize((Vec_Int_t *)p_01);
  if (iVar2 == 0) {
    Vec_IntFree((Vec_Int_t *)p_01);
    Abc_CexFreeP((Abc_Cex_t **)(*(long *)&pCex->nRegs + 0x110));
    pAVar3 = Gla_ManDeriveCex((Gla_Man_t *)pCex,vVec);
    *(Abc_Cex_t **)(*(long *)&pCex->nRegs + 0x110) = pAVar3;
    Vec_IntFree(vVec);
    p_local = (Gla_Man_t *)0x0;
  }
  else {
    Vec_IntFree(vVec);
    local_3c = 0;
    while( true ) {
      iVar2 = Vec_IntSize((Vec_Int_t *)p_01);
      bVar4 = false;
      if (local_3c < iVar2) {
        p_00 = *(Gia_Man_t **)&pCex->nRegs;
        iVar2 = Vec_IntEntry((Vec_Int_t *)p_01,local_3c);
        pGStack_38 = Gia_ManObj(p_00,iVar2);
        bVar4 = pGStack_38 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      lVar1 = *(long *)&pCex[2].nRegs;
      iVar2 = Gia_ObjId(*(Gia_Man_t **)&pCex->nRegs,pGStack_38);
      Vec_IntWriteEntry((Vec_Int_t *)p_01,local_3c,*(int *)(lVar1 + (long)iVar2 * 4));
      local_3c = local_3c + 1;
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)p_01);
    pCex[3].nRegs = iVar2 + pCex[3].nRegs;
    p_local = p_01;
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Gla_ManRefinement( Gla_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap, * vVec;
    Gia_Obj_t * pObj;
    int i;
    Gia_GlaPrepareCexAndMap( p, &pCex, &vMap );
    vVec = Rnm_ManRefine( p->pRnm, pCex, vMap, p->pPars->fPropFanout, p->pPars->fNewRefine, 1 );
    Abc_CexFree( pCex );
    if ( Vec_IntSize(vVec) == 0 )
    {
        Vec_IntFree( vVec );
        Abc_CexFreeP( &p->pGia->pCexSeq );
        p->pGia->pCexSeq = Gla_ManDeriveCex( p, vMap );
        Vec_IntFree( vMap );
        return NULL;
    }
    Vec_IntFree( vMap );
    // remap them into GLA objects
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        Vec_IntWriteEntry( vVec, i, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] );
    p->nObjAdded += Vec_IntSize(vVec);
    return vVec;
}